

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall
ON_PolylineCurve::Evaluate
          (ON_PolylineCurve *this,double t,int der_count,int v_stride,double *v,int side,int *hint)

{
  double dVar1;
  int iVar2;
  ON_3dPoint *pOVar3;
  bool bVar4;
  int cv_count;
  int iVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  ON_3dPoint p;
  ON_3dVector d;
  double local_b8;
  ON_3dPoint local_88;
  ON_3dPoint local_68;
  ON_3dPoint local_48;
  
  cv_count = ON_Polyline::PointCount(&this->m_pline);
  if (1 < cv_count) {
    iVar5 = 0;
    if ((this->m_t).m_count < 1) {
      pdVar6 = (double *)0x0;
    }
    else {
      pdVar6 = (this->m_t).m_a;
    }
    if (hint != (int *)0x0) {
      iVar5 = *hint;
    }
    iVar5 = ON_NurbsSpanIndex(2,cv_count,pdVar6,t,side,iVar5);
    local_b8 = t;
    if (((side == 2) || (side == -2)) &&
       (pdVar6 = (this->m_t).m_a, local_88.x = t,
       bVar4 = ON_TuneupEvaluationParameter(side,pdVar6[iVar5],pdVar6[(long)iVar5 + 1],&local_88.x),
       bVar4)) {
      local_b8 = local_88.x;
      if ((this->m_t).m_count < 1) {
        pdVar6 = (double *)0x0;
      }
      else {
        pdVar6 = (this->m_t).m_a;
      }
      iVar5 = ON_NurbsSpanIndex(2,cv_count,pdVar6,local_88.x,side,iVar5);
    }
    pdVar6 = (this->m_t).m_a;
    dVar1 = pdVar6[iVar5];
    dVar10 = pdVar6[(long)iVar5 + 1];
    uVar9 = -(ulong)(local_b8 == dVar10);
    dVar10 = dVar10 - dVar1;
    dVar1 = (double)(uVar9 & 0x3ff0000000000000 | ~uVar9 & (ulong)((local_b8 - dVar1) / dVar10));
    ::operator*(&local_68,1.0 - dVar1,
                (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a + iVar5);
    ::operator*(&local_48,dVar1,
                (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a +
                (long)iVar5 + 1);
    ON_3dPoint::operator+(&local_88,&local_68,&local_48);
    *v = local_88.x;
    v[1] = local_88.y;
    if (this->m_dim == 3) {
      v[2] = local_88.z;
    }
    if (0 < der_count) {
      lVar7 = (long)v_stride;
      pOVar3 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
      ON_3dPoint::operator-((ON_3dVector *)&local_48,pOVar3 + (long)iVar5 + 1,pOVar3 + iVar5);
      ::operator*((ON_3dVector *)&local_68,1.0 / dVar10,(ON_3dVector *)&local_48);
      v[lVar7] = local_68.x;
      (v + lVar7)[1] = local_68.y;
      iVar2 = this->m_dim;
      if (iVar2 == 3) {
        v[lVar7 + 2] = local_68.z;
      }
      if (der_count != 1) {
        iVar8 = der_count + -1;
        pdVar6 = v + lVar7 * 2 + 2;
        do {
          pdVar6[-2] = 0.0;
          pdVar6[-1] = 0.0;
          if (iVar2 == 3) {
            *pdVar6 = 0.0;
          }
          pdVar6 = pdVar6 + lVar7;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
    }
    if (hint != (int *)0x0) {
      *hint = iVar5;
    }
  }
  return 1 < cv_count;
}

Assistant:

bool 
ON_PolylineCurve::Evaluate( // returns false if unable to evaluate
       double t,       // evaluation parameter
       int der_count,  // number of derivatives (>=0)
       int v_stride,   // v[] array stride (>=Dimension())
       double* v,      // v[] array of length stride*(ndir+1)
       int side,       // optional - determines which side to evaluate from
                       //         0 = default
                       //      <  0 to evaluate from below, 
                       //      >  0 to evaluate from above
       int* hint       // optional - evaluation hint (int) used to speed
                       //            repeated evaluations
       ) const
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 2 ) 
  {
    int segment_index = ON_NurbsSpanIndex(2,count,m_t,t,side,(hint)?*hint:0);

    if ( -2 == side || 2 == side )
    {
      // 9 November 2010 Dale Lear - ON_TuneupEvaluationParameter fix
      //   When evaluation passes through ON_CurveProxy or ON_PolyCurve reparamterization
      //   and the original side parameter was -1 or +1, it is changed to -2 or +2
      //   to indicate that if t is numerically closed to an end parameter, then
      //   it should be tuned up to be at the end parameter.
      double a = t;
      if ( ON_TuneupEvaluationParameter( side, m_t[segment_index], m_t[segment_index+1], &a) )
      {
        // recalculate segment index
        t = a;
        segment_index = ON_NurbsSpanIndex(2,count,m_t,t,side,segment_index);
      }
    }

    const double t0 = m_t[segment_index];
    const double t1 = m_t[segment_index+1];
    double s = (t == t1) ? 1.0 : (t-t0)/(t1-t0);
    const ON_3dPoint p = (1.0-s)*m_pline[segment_index] + s*m_pline[segment_index+1];
    v[0] = p.x;
    v[1] = p.y;
    if ( m_dim == 3 )
      v[2] = p.z;
    if ( der_count >= 1 ) {
      v += v_stride;
      ON_3dVector d = 1.0/(t1-t0)*(m_pline[segment_index+1] - m_pline[segment_index]);
      v[0] = d.x;
      v[1] = d.y;
      if ( m_dim == 3 )
        v[2] = d.z;
    }
    for ( int di = 2; di <= der_count; di++ ) {
      v += v_stride;
      v[0] = 0.0;
      v[1] = 0.0;
      if ( m_dim == 3 )
        v[2] = 0.0;
    }
    if ( hint )
      *hint = segment_index;
    rc = true;
  }
  return rc;
}